

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

ssize_t compress_out(archive_write *a,void *buff,size_t s,la_zaction run)

{
  void *pvVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  ulong s_00;
  uint64_t bytes;
  int r;
  _7zip_conflict *zip;
  la_zaction run_local;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  if (((run == ARCHIVE_Z_FINISH) && (*(long *)((long)pvVar1 + 0xa0) == 0)) && (s == 0)) {
    a_local = (archive_write *)0x0;
  }
  else {
    if (((*(uint *)((long)pvVar1 + 0x7c) & 1) != 0) && (s != 0)) {
      uVar2 = crc32(*(undefined4 *)((long)pvVar1 + 0x74),buff,s & 0xffffffff);
      *(undefined4 *)((long)pvVar1 + 0x74) = uVar2;
    }
    *(void **)((long)pvVar1 + 0x90) = buff;
    *(size_t *)((long)pvVar1 + 0x98) = s;
LAB_001bdb73:
    do {
      iVar3 = compression_code(&a->archive,(la_zstream_conflict *)((long)pvVar1 + 0x90),run);
      if ((iVar3 != 0) && (iVar3 != 1)) {
        return -0x1e;
      }
      if (*(long *)((long)pvVar1 + 0xb0) == 0) {
        iVar4 = write_to_temp(a,(void *)((long)pvVar1 + 0x110),0xf000);
        if (iVar4 != 0) {
          return -0x1e;
        }
        *(long *)((long)pvVar1 + 0xa8) = (long)pvVar1 + 0x110;
        *(undefined8 *)((long)pvVar1 + 0xb0) = 0xf000;
        if ((*(uint *)((long)pvVar1 + 0x7c) & 2) != 0) {
          uVar2 = crc32(*(undefined4 *)((long)pvVar1 + 0x78),(long)pvVar1 + 0x110,0xf000);
          *(undefined4 *)((long)pvVar1 + 0x78) = uVar2;
        }
        if ((run == ARCHIVE_Z_FINISH) && (iVar3 != 1)) goto LAB_001bdb73;
      }
    } while (*(long *)((long)pvVar1 + 0x98) != 0);
    a_local = (archive_write *)s;
    if (run == ARCHIVE_Z_FINISH) {
      s_00 = 0xf000 - *(long *)((long)pvVar1 + 0xb0);
      iVar3 = write_to_temp(a,(void *)((long)pvVar1 + 0x110),s_00);
      if (iVar3 == 0) {
        if (((*(uint *)((long)pvVar1 + 0x7c) & 2) != 0) && (s_00 != 0)) {
          uVar2 = crc32(*(undefined4 *)((long)pvVar1 + 0x78),(long)pvVar1 + 0x110,s_00 & 0xffffffff)
          ;
          *(undefined4 *)((long)pvVar1 + 0x78) = uVar2;
        }
      }
      else {
        a_local = (archive_write *)0xffffffffffffffe2;
      }
    }
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
compress_out(struct archive_write *a, const void *buff, size_t s,
    enum la_zaction run)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	int r;

	if (run == ARCHIVE_Z_FINISH && zip->stream.total_in == 0 && s == 0)
		return (0);

	if ((zip->crc32flg & PRECODE_CRC32) && s)
		zip->precode_crc32 = crc32(zip->precode_crc32, buff,
		    (unsigned)s);
	zip->stream.next_in = (const unsigned char *)buff;
	zip->stream.avail_in = s;
	for (;;) {
		/* Compress file data. */
		r = compression_code(&(a->archive), &(zip->stream), run);
		if (r != ARCHIVE_OK && r != ARCHIVE_EOF)
			return (ARCHIVE_FATAL);
		if (zip->stream.avail_out == 0) {
			if (write_to_temp(a, zip->wbuff, sizeof(zip->wbuff))
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			zip->stream.next_out = zip->wbuff;
			zip->stream.avail_out = sizeof(zip->wbuff);
			if (zip->crc32flg & ENCODED_CRC32)
				zip->encoded_crc32 = crc32(zip->encoded_crc32,
				    zip->wbuff, sizeof(zip->wbuff));
			if (run == ARCHIVE_Z_FINISH && r != ARCHIVE_EOF)
				continue;
		}
		if (zip->stream.avail_in == 0)
			break;
	}
	if (run == ARCHIVE_Z_FINISH) {
		uint64_t bytes = sizeof(zip->wbuff) - zip->stream.avail_out;
		if (write_to_temp(a, zip->wbuff, (size_t)bytes) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		if ((zip->crc32flg & ENCODED_CRC32) && bytes)
			zip->encoded_crc32 = crc32(zip->encoded_crc32,
			    zip->wbuff, (unsigned)bytes);
	}

	return (s);
}